

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replistruct.cpp
# Opt level: O0

void __thiscall r_comp::RepliMacro::~RepliMacro(RepliMacro *this)

{
  shared_ptr<r_comp::RepliStruct> local_30;
  shared_ptr<r_comp::RepliStruct> local_20;
  RepliMacro *local_10;
  RepliMacro *this_local;
  
  local_10 = this;
  std::__cxx11::string::operator=((string *)this,"");
  std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_20,(nullptr_t)0x0);
  std::shared_ptr<r_comp::RepliStruct>::operator=(&this->src,&local_20);
  std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_20);
  std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_30,(nullptr_t)0x0);
  std::shared_ptr<r_comp::RepliStruct>::operator=(&this->dest,&local_30);
  std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_30);
  std::__cxx11::string::~string((string *)&this->error);
  std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&this->dest);
  std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&this->src);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

RepliMacro::~RepliMacro()
{
    name = "";
    src = nullptr;
    dest = nullptr;
}